

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImmutableList.cpp
# Opt level: O0

void __thiscall
regex::ImmutableStringBuilder<8>::AppendInt32(ImmutableStringBuilder<8> *this,int32 value)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  WCHAR local_38 [2];
  HRESULT hr;
  WCHAR buffer [11];
  int32 value_local;
  ImmutableStringBuilder<8> *this_local;
  
  HVar3 = StringCchPrintfW(local_38,0xb,L"%d",(ulong)(uint)value);
  if (HVar3 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
                       ,0x15,"(((HRESULT)(hr) >= 0))","StringCchPrintfW");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (HVar3 < 0) {
    Js::Throw::OutOfMemory();
  }
  AppendWithCopy(this,local_38);
  return;
}

Assistant:

void regex::ImmutableStringBuilder<chunkSize>::AppendInt32(int32 value)
{
    WCHAR buffer[11]; // -2,147,483,648 w.o ',' + \0
    HRESULT hr = S_OK;
    hr = StringCchPrintfW(buffer, _countof(buffer), _u("%d"), value);
    AssertMsg(SUCCEEDED(hr), "StringCchPrintfW");
    if (FAILED(hr) )
    {
        Js::Throw::OutOfMemory();
    }

    // append to the stringBuilder string
    this->AppendWithCopy(buffer);
}